

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::Test<float,1,true,2u,false>
          (StorageAndSubImageTest *this)

{
  bool bVar1;
  GLenum internal_format;
  bool result;
  StorageAndSubImageTest *this_local;
  
  internal_format = Reference::InternalFormat<float,1,true>();
  PrepareFramebuffer(this,internal_format,2);
  bVar1 = CreateTexture<float,1,true,2u,false>(this);
  if (bVar1) {
    Draw(this);
    this_local._7_1_ = Check<float,1,true,2u>(this);
    CleanTexture(this);
    CleanFramebuffer(this);
    CleanErrors(this);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StorageAndSubImageTest::Test()
{
	/* Setup. */
	PrepareFramebuffer(InternalFormat<T, S, N>(), D);

	if (!CreateTexture<T, S, N, D, I>())
	{
		return false;
	}

	/* Action. */
	Draw();

	/* Compare results with reference. */
	bool result = Check<T, S, N, D>();

	/* Cleanup. */
	CleanTexture();
	CleanFramebuffer();
	CleanErrors();

	/* Pass result. */
	return result;
}